

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

uint64_t folder_uncompressed_size(_7z_folder *f)

{
  uint uVar1;
  uint local_24;
  uint i;
  uint pairs;
  int n;
  _7z_folder *f_local;
  
  i = (uint)f->numOutStreams;
  uVar1 = (uint)f->numBindPairs;
  do {
    i = i - 1;
    if ((int)i < 0) {
      return 0;
    }
    local_24 = 0;
    while ((local_24 < uVar1 && (f->bindPairs[local_24].outIndex != (long)(int)i))) {
      local_24 = local_24 + 1;
    }
  } while (local_24 < uVar1);
  return f->unPackSize[(int)i];
}

Assistant:

static uint64_t
folder_uncompressed_size(struct _7z_folder *f)
{
	int n = (int)f->numOutStreams;
	unsigned pairs = (unsigned)f->numBindPairs;

	while (--n >= 0) {
		unsigned i;
		for (i = 0; i < pairs; i++) {
			if (f->bindPairs[i].outIndex == (uint64_t)n)
				break;
		}
		if (i >= pairs)
			return (f->unPackSize[n]);
	}
	return (0);
}